

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialTxInIndex
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,uint32_t *index)

{
  bool bVar1;
  undefined1 uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  uint32_t in_ECX;
  char *in_RDX;
  char *in_RSI;
  uint32_t *in_R8;
  CfdException *except;
  exception *std_except;
  OutPoint outpoint;
  ConfidentialTransactionContext tx;
  string *in_stack_fffffffffffffd78;
  ConfidentialTransactionContext *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  CfdError error_code;
  allocator *paVar5;
  CfdException *in_stack_fffffffffffffda0;
  OutPoint *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  allocator local_209;
  string local_208;
  Txid local_1e8;
  OutPoint local_1c8;
  allocator local_199;
  string local_198 [222];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  uint32_t *local_30;
  uint32_t local_24;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x367;
    local_58.funcname = "CfdGetConfidentialTxInIndex";
    cfd::core::logger::warn<>(&local_58,"tx is null or empty.");
    local_7a = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Failed to parameter. tx is null or empty.",&local_79);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffda0,error_code,in_stack_fffffffffffffd90);
    local_7a = 0;
    __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar2 = cfd::capi::IsEmptyString(local_20);
  if (!(bool)uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,local_18,&local_199);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    paVar5 = &local_209;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,local_20,paVar5);
    cfd::core::Txid::Txid(&local_1e8,&local_208);
    cfd::core::OutPoint::OutPoint(&local_1c8,&local_1e8,local_24);
    cfd::core::Txid::~Txid((Txid *)0x5aa7a8);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    if (local_30 != (uint32_t *)0x0) {
      uVar3 = cfd::ConfidentialTransactionContext::GetTxInIndex
                        ((ConfidentialTransactionContext *)CONCAT17(uVar2,in_stack_fffffffffffffdc0)
                         ,in_stack_fffffffffffffdb8);
      *local_30 = uVar3;
    }
    local_4 = 0;
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x5aa8e6);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffffd80);
    return local_4;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x36d;
  local_98.funcname = "CfdGetConfidentialTxInIndex";
  cfd::core::logger::warn<>(&local_98,"txid is null or empty.");
  local_ba = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  paVar5 = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Failed to parameter. txid is null or empty.",paVar5);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffda0,error_code,in_stack_fffffffffffffd90);
  local_ba = 0;
  __cxa_throw(uVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInIndex(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    uint32_t* index) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    OutPoint outpoint(Txid(txid), vout);
    if (index != nullptr) {
      *index = tx.GetTxInIndex(outpoint);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}